

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalable_encoder.c
# Opt level: O1

int main(int argc,char **argv)

{
  char *__nptr;
  char *__nptr_00;
  char *__filename;
  char *__filename_00;
  bool bVar1;
  _Bool _Var2;
  aom_codec_err_t aVar3;
  aom_codec_iface_t *iface;
  ulong uVar4;
  ulong uVar5;
  aom_image_t *paVar6;
  char *pcVar7;
  FILE *__stream;
  FILE *__stream_00;
  FILE *__stream_01;
  int iVar8;
  int frame_index;
  char *__filename_01;
  uint d_h;
  int iVar9;
  int iVar10;
  uint d_w;
  int iVar11;
  aom_codec_ctx_t codec;
  aom_image_t raw1;
  aom_image_t raw0;
  aom_codec_enc_cfg_t cfg;
  aom_codec_ctx_t local_548;
  long local_510;
  aom_image_t local_508;
  aom_image_t local_460;
  aom_codec_enc_cfg_t local_3b8;
  
  exec_name = *argv;
  if (argc == 8) {
    pcVar7 = argv[1];
    __nptr = argv[2];
    __nptr_00 = argv[3];
    __filename = argv[4];
    __filename_00 = argv[5];
    __filename_01 = argv[6];
    local_510 = strtol(argv[7],(char **)0x0,0);
    iface = get_aom_encoder_by_short_name(pcVar7);
    if (iface == (aom_codec_iface_t *)0x0) {
      pcVar7 = "Unsupported codec.";
    }
    else {
      get_fourcc_by_aom_encoder(iface);
      uVar4 = strtol(__nptr,(char **)0x0,0);
      uVar5 = strtol(__nptr_00,(char **)0x0,0);
      d_w = (uint)uVar4;
      d_h = (uint)uVar5;
      if (((((uVar4 & 1) != 0) || ((int)d_w < 1)) || ((int)d_h < 1)) || ((uVar5 & 1) != 0)) {
        die("Invalid frame size: %dx%d",uVar4 & 0xffffffff,uVar5 & 0xffffffff);
      }
      paVar6 = aom_img_alloc(&local_460,AOM_IMG_FMT_I420,d_w,d_h,1);
      if (paVar6 == (aom_image_t *)0x0) {
        pcVar7 = "Failed to allocate image for layer 0.";
      }
      else {
        paVar6 = aom_img_alloc(&local_508,AOM_IMG_FMT_I420,d_w,d_h,1);
        if (paVar6 != (aom_image_t *)0x0) {
          pcVar7 = aom_codec_iface_name(iface);
          printf("Using %s\n",pcVar7);
          aVar3 = aom_codec_enc_config_default(iface,&local_3b8,0);
          if (aVar3 != AOM_CODEC_OK) {
            pcVar7 = "Failed to get default codec config.";
LAB_0011ea03:
            die_codec(&local_548,pcVar7);
          }
          local_3b8.g_timebase.num = 1;
          local_3b8.g_timebase.den = 0x1e;
          local_3b8.rc_target_bitrate = 200;
          local_3b8.g_error_resilient = 0;
          local_3b8.g_lag_in_frames = 0;
          local_3b8.rc_end_usage = AOM_Q;
          local_3b8.save_as_annexb = 0;
          local_3b8.g_w = d_w;
          local_3b8.g_h = d_h;
          __stream = fopen64(__filename_01,"wb");
          if (__stream == (FILE *)0x0) {
            pcVar7 = "Failed to open %s for writing.";
          }
          else {
            __stream_00 = fopen64(__filename,"rb");
            if (__stream_00 != (FILE *)0x0) {
              __stream_01 = fopen64(__filename_00,"rb");
              if (__stream_01 != (FILE *)0x0) {
                aVar3 = aom_codec_enc_init_ver(&local_548,iface,&local_3b8,0,0x1d);
                if (aVar3 != AOM_CODEC_OK) {
                  pcVar7 = "Failed to initialize encoder";
                  goto LAB_0011ea72;
                }
                aVar3 = aom_codec_control(&local_548,0xd,8);
                if (aVar3 == AOM_CODEC_OK) {
                  aVar3 = aom_codec_control(&local_548,0x21,2);
                  if (aVar3 == AOM_CODEC_OK) {
                    aVar3 = aom_codec_control(&local_548,0x46,3);
                    if (aVar3 == AOM_CODEC_OK) {
                      aVar3 = aom_codec_control(&local_548,0x1b,2);
                      if (aVar3 == AOM_CODEC_OK) {
                        iVar11 = 1;
                        iVar9 = 0;
                        uVar4 = 0;
                        iVar8 = 1;
                        do {
                          frame_index = iVar8;
                          iVar8 = frame_index + -1;
                          _Var2 = aom_img_read(&local_460,(FILE *)__stream_00);
                          if (!_Var2) goto LAB_0011e93c;
                          iVar10 = 1;
                          if ((int)(uVar4 / 100) * 100 + iVar9 != 0) {
                            iVar10 = 0x77e0000;
                          }
                          local_3b8.g_w = d_w;
                          local_3b8.g_h = d_h;
                          aVar3 = aom_codec_enc_config_set(&local_548,&local_3b8);
                          if (aVar3 != AOM_CODEC_OK) {
                            pcVar7 = "Failed to set enc cfg for layer 0";
                            goto LAB_0011ea03;
                          }
                          aVar3 = aom_codec_control(&local_548,0xc,0);
                          if (aVar3 != AOM_CODEC_OK) {
                            pcVar7 = "Failed to set layer id to 0";
                            goto LAB_0011ea03;
                          }
                          aVar3 = aom_codec_control(&local_548,0x19,0x3e);
                          if (aVar3 != AOM_CODEC_OK) {
LAB_0011e9d8:
                            pcVar7 = "Failed to set cq level";
                            goto LAB_0011ea03;
                          }
                          encode_frame(&local_548,&local_460,iVar8,iVar10,(FILE *)__stream);
                          local_3b8.g_w = d_w;
                          local_3b8.g_h = d_h;
                          aom_img_read(&local_508,(FILE *)__stream_01);
                          aVar3 = aom_codec_enc_config_set(&local_548,&local_3b8);
                          if (aVar3 != AOM_CODEC_OK) {
                            pcVar7 = "Failed to set enc cfg for layer 1";
                            goto LAB_0011ea03;
                          }
                          aVar3 = aom_codec_control(&local_548,0xc,1);
                          if (aVar3 != AOM_CODEC_OK) {
                            pcVar7 = "Failed to set layer id to 1";
                            goto LAB_0011ea03;
                          }
                          aVar3 = aom_codec_control(&local_548,0x19,10);
                          if (aVar3 != AOM_CODEC_OK) goto LAB_0011e9d8;
                          iVar10 = (int)local_510;
                          encode_frame(&local_548,&local_508,frame_index,0x7fe0000,(FILE *)__stream)
                          ;
                          uVar4 = (ulong)((int)uVar4 + 1);
                          bVar1 = iVar11 < iVar10;
                          iVar9 = iVar9 + -1;
                          iVar11 = iVar11 + 1;
                          iVar8 = frame_index + 2;
                        } while (bVar1 || iVar10 < 1);
                        iVar8 = frame_index + 1;
LAB_0011e93c:
                        do {
                          iVar9 = encode_frame(&local_548,(aom_image_t *)0x0,-1,0,(FILE *)__stream);
                        } while (iVar9 != 0);
                        putchar(10);
                        fclose(__stream_00);
                        fclose(__stream_01);
                        printf("Processed %d frames.\n",(ulong)(uint)(iVar8 / 2));
                        aom_img_free(&local_460);
                        aom_img_free(&local_508);
                        aVar3 = aom_codec_destroy(&local_548);
                        if (aVar3 == AOM_CODEC_OK) {
                          fclose(__stream);
                          return 0;
                        }
                        pcVar7 = "Failed to destroy codec.";
                      }
                      else {
                        pcVar7 = "Failed to set number of spatial layers to 2";
                      }
                    }
                    else {
                      pcVar7 = "Failed to set num of tile groups to 3";
                    }
                  }
                  else {
                    pcVar7 = "Failed to set tile columns to 2";
                  }
                }
                else {
                  pcVar7 = "Failed to set cpu to 8";
                }
                goto LAB_0011ea03;
              }
            }
            pcVar7 = "Failed to open %s for reading.";
            __filename_01 = __filename;
          }
          die(pcVar7,__filename_01);
        }
        pcVar7 = "Failed to allocate image for layer 1.";
      }
    }
  }
  else {
    pcVar7 = "Invalid number of arguments";
  }
LAB_0011ea72:
  die(pcVar7);
}

Assistant:

int main(int argc, char **argv) {
  FILE *infile0 = NULL;
  FILE *infile1 = NULL;
  aom_codec_enc_cfg_t cfg;
  int frame_count = 0;
  aom_image_t raw0, raw1;
  aom_codec_err_t res;
  AvxVideoInfo info;
  const int fps = 30;
  const int bitrate = 200;
  int keyframe_interval = 0;
  int max_frames = 0;
  int frames_encoded = 0;
  const char *codec_arg = NULL;
  const char *width_arg = NULL;
  const char *height_arg = NULL;
  const char *infile0_arg = NULL;
  const char *infile1_arg = NULL;
  const char *outfile_arg = NULL;
  //  const char *keyframe_interval_arg = NULL;
  FILE *outfile = NULL;

  exec_name = argv[0];

  // Clear explicitly, as simply assigning "{ 0 }" generates
  // "missing-field-initializers" warning in some compilers.
  memset(&info, 0, sizeof(info));

  if (argc != 8) die("Invalid number of arguments");

  codec_arg = argv[1];
  width_arg = argv[2];
  height_arg = argv[3];
  infile0_arg = argv[4];
  infile1_arg = argv[5];
  outfile_arg = argv[6];
  max_frames = (int)strtol(argv[7], NULL, 0);

  aom_codec_iface_t *encoder = get_aom_encoder_by_short_name(codec_arg);
  if (!encoder) die("Unsupported codec.");

  info.codec_fourcc = get_fourcc_by_aom_encoder(encoder);
  info.frame_width = (int)strtol(width_arg, NULL, 0);
  info.frame_height = (int)strtol(height_arg, NULL, 0);
  info.time_base.numerator = 1;
  info.time_base.denominator = fps;

  if (info.frame_width <= 0 || info.frame_height <= 0 ||
      (info.frame_width % 2) != 0 || (info.frame_height % 2) != 0) {
    die("Invalid frame size: %dx%d", info.frame_width, info.frame_height);
  }

  if (!aom_img_alloc(&raw0, AOM_IMG_FMT_I420, info.frame_width,
                     info.frame_height, 1)) {
    die("Failed to allocate image for layer 0.");
  }
  if (!aom_img_alloc(&raw1, AOM_IMG_FMT_I420, info.frame_width,
                     info.frame_height, 1)) {
    die("Failed to allocate image for layer 1.");
  }

  //  keyframe_interval = (int)strtol(keyframe_interval_arg, NULL, 0);
  keyframe_interval = 100;
  if (keyframe_interval < 0) die("Invalid keyframe interval value.");

  printf("Using %s\n", aom_codec_iface_name(encoder));

  aom_codec_ctx_t codec;
  res = aom_codec_enc_config_default(encoder, &cfg, 0);
  if (res) die_codec(&codec, "Failed to get default codec config.");

  cfg.g_w = info.frame_width;
  cfg.g_h = info.frame_height;
  cfg.g_timebase.num = info.time_base.numerator;
  cfg.g_timebase.den = info.time_base.denominator;
  cfg.rc_target_bitrate = bitrate;
  cfg.g_error_resilient = 0;
  cfg.g_lag_in_frames = 0;
  cfg.rc_end_usage = AOM_Q;
  cfg.save_as_annexb = 0;

  outfile = fopen(outfile_arg, "wb");
  if (!outfile) die("Failed to open %s for writing.", outfile_arg);

  if (!(infile0 = fopen(infile0_arg, "rb")))
    die("Failed to open %s for reading.", infile0_arg);
  if (!(infile1 = fopen(infile1_arg, "rb")))
    die("Failed to open %s for reading.", infile0_arg);

  if (aom_codec_enc_init(&codec, encoder, &cfg, 0))
    die("Failed to initialize encoder");
  if (aom_codec_control(&codec, AOME_SET_CPUUSED, 8))
    die_codec(&codec, "Failed to set cpu to 8");

  if (aom_codec_control(&codec, AV1E_SET_TILE_COLUMNS, 2))
    die_codec(&codec, "Failed to set tile columns to 2");
  if (aom_codec_control(&codec, AV1E_SET_NUM_TG, 3))
    die_codec(&codec, "Failed to set num of tile groups to 3");

  if (aom_codec_control(&codec, AOME_SET_NUMBER_SPATIAL_LAYERS, 2))
    die_codec(&codec, "Failed to set number of spatial layers to 2");

  // Encode frames.
  while (aom_img_read(&raw0, infile0)) {
    int flags = 0;

    // configure and encode base layer

    if (keyframe_interval > 0 && frames_encoded % keyframe_interval == 0)
      flags |= AOM_EFLAG_FORCE_KF;
    else
      // use previous base layer (LAST) as sole reference
      // save this frame as LAST to be used as reference by enhanmcent layer
      // and next base layer
      flags |= AOM_EFLAG_NO_REF_LAST2 | AOM_EFLAG_NO_REF_LAST3 |
               AOM_EFLAG_NO_REF_GF | AOM_EFLAG_NO_REF_ARF |
               AOM_EFLAG_NO_REF_BWD | AOM_EFLAG_NO_REF_ARF2 |
               AOM_EFLAG_NO_UPD_GF | AOM_EFLAG_NO_UPD_ARF |
               AOM_EFLAG_NO_UPD_ENTROPY;
    cfg.g_w = info.frame_width;
    cfg.g_h = info.frame_height;
    if (aom_codec_enc_config_set(&codec, &cfg))
      die_codec(&codec, "Failed to set enc cfg for layer 0");
    if (aom_codec_control(&codec, AOME_SET_SPATIAL_LAYER_ID, 0))
      die_codec(&codec, "Failed to set layer id to 0");
    if (aom_codec_control(&codec, AOME_SET_CQ_LEVEL, 62))
      die_codec(&codec, "Failed to set cq level");
    encode_frame(&codec, &raw0, frame_count++, flags, outfile);

    // configure and encode enhancement layer

    //  use LAST (base layer) as sole reference
    flags = AOM_EFLAG_NO_REF_LAST2 | AOM_EFLAG_NO_REF_LAST3 |
            AOM_EFLAG_NO_REF_GF | AOM_EFLAG_NO_REF_ARF | AOM_EFLAG_NO_REF_BWD |
            AOM_EFLAG_NO_REF_ARF2 | AOM_EFLAG_NO_UPD_LAST |
            AOM_EFLAG_NO_UPD_GF | AOM_EFLAG_NO_UPD_ARF |
            AOM_EFLAG_NO_UPD_ENTROPY;
    cfg.g_w = info.frame_width;
    cfg.g_h = info.frame_height;
    aom_img_read(&raw1, infile1);
    if (aom_codec_enc_config_set(&codec, &cfg))
      die_codec(&codec, "Failed to set enc cfg for layer 1");
    if (aom_codec_control(&codec, AOME_SET_SPATIAL_LAYER_ID, 1))
      die_codec(&codec, "Failed to set layer id to 1");
    if (aom_codec_control(&codec, AOME_SET_CQ_LEVEL, 10))
      die_codec(&codec, "Failed to set cq level");
    encode_frame(&codec, &raw1, frame_count++, flags, outfile);

    frames_encoded++;

    if (max_frames > 0 && frames_encoded >= max_frames) break;
  }

  // Flush encoder.
  while (encode_frame(&codec, NULL, -1, 0, outfile)) continue;

  printf("\n");
  fclose(infile0);
  fclose(infile1);
  printf("Processed %d frames.\n", frame_count / 2);

  aom_img_free(&raw0);
  aom_img_free(&raw1);
  if (aom_codec_destroy(&codec)) die_codec(&codec, "Failed to destroy codec.");

  fclose(outfile);

  return EXIT_SUCCESS;
}